

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O3

char ** tbx_seqnames(tbx_t *tbx,int *n)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  char **ppcVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  
  puVar2 = (uint *)tbx->dict;
  if (puVar2 == (uint *)0x0) {
    uVar8 = 0;
    ppcVar4 = (char **)0x0;
  }
  else {
    uVar8 = puVar2[1];
    ppcVar4 = (char **)calloc((long)(int)uVar8,8);
    uVar1 = *puVar2;
    if ((ulong)uVar1 != 0) {
      lVar3 = *(long *)(puVar2 + 4);
      bVar6 = 0;
      uVar7 = 0;
      do {
        if ((*(uint *)(lVar3 + (uVar7 >> 4 & 0xfffffff) * 4) >> (bVar6 & 0x1e) & 3) == 0) {
          iVar5 = (int)*(undefined8 *)(*(long *)(puVar2 + 8) + uVar7 * 8);
          if ((int)uVar8 <= iVar5) {
            __assert_fail("tid<m",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/tbx.c"
                          ,0x137,"const char **tbx_seqnames(tbx_t *, int *)");
          }
          ppcVar4[iVar5] = *(char **)(*(long *)(puVar2 + 6) + uVar7 * 8);
        }
        uVar7 = uVar7 + 1;
        bVar6 = bVar6 + 2;
      } while (uVar1 != uVar7);
    }
    if (0 < (int)uVar8) {
      uVar7 = 0;
      do {
        if (ppcVar4[uVar7] == (char *)0x0) {
          __assert_fail("names[tid]",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/tbx.c"
                        ,0x13c,"const char **tbx_seqnames(tbx_t *, int *)");
        }
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
    }
  }
  *n = uVar8;
  return ppcVar4;
}

Assistant:

const char **tbx_seqnames(tbx_t *tbx, int *n)
{
    khash_t(s2i) *d = (khash_t(s2i)*)tbx->dict;
    if (d == NULL)
    {
        *n = 0;
        return NULL;
    }
    int tid, m = kh_size(d);
    const char **names = (const char**) calloc(m,sizeof(const char*));
    khint_t k;
    for (k=kh_begin(d); k<kh_end(d); k++)
    {
        if ( !kh_exist(d,k) ) continue;
        tid = kh_val(d,k);
        assert( tid<m );
        names[tid] = kh_key(d,k);
    }
    // sanity check: there should be no gaps
    for (tid=0; tid<m; tid++)
        assert(names[tid]);
    *n = m;
    return names;
}